

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O3

Matcher * __thiscall
trivialre::re_compiler::C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy>
::MaybeSeq(Matcher *__return_storage_ptr__,
          C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy> *this,
          Matcher *left,
          optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
          *right)

{
  _Manager_type *pp_Var1;
  _Manager_type p_Var2;
  code *pcVar3;
  undefined8 uVar4;
  byte bVar5;
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type local_80;
  _Any_data local_78;
  code *local_68;
  _Invoker_type local_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  _Any_data local_38;
  code *local_28;
  _Invoker_type p_Stack_20;
  
  pp_Var1 = &(left->super__Function_base)._M_manager;
  if ((right->
      super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
      .
      super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ._M_engaged == true) {
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_48 = (_Manager_type)0x0;
    local_80 = left->_M_invoker;
    p_Var2 = (left->super__Function_base)._M_manager;
    bVar5 = 1;
    if (p_Var2 != (_Manager_type)0x0) {
      local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&(left->super__Function_base)._M_functor
      ;
      local_58._8_8_ = *(undefined8 *)((long)&(left->super__Function_base)._M_functor + 8);
      *pp_Var1 = (_Manager_type)0x0;
      left->_M_invoker = (_Invoker_type)0x0;
      bVar5 = (right->
              super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
              .
              super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
              ._M_engaged;
      local_48 = p_Var2;
    }
    p_Stack_40 = local_80;
    if ((bVar5 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    local_28 = (code *)0x0;
    local_60 = (right->
               super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
               .
               super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
               ._M_payload._M_value._M_invoker;
    pcVar3 = *(code **)((long)&(right->
                               super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                               ._M_payload + 0x10);
    if (pcVar3 != (code *)0x0) {
      local_38._M_unused._0_8_ =
           (undefined8)
           *(undefined8 *)
            &(right->
             super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
             .
             super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
             ._M_payload;
      local_38._8_8_ =
           *(undefined8 *)
            ((long)&(right->
                    super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                    ._M_payload + 8);
      *(undefined8 *)
       ((long)&(right->
               super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
               .
               super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
               ._M_payload + 0x10) = 0;
      (right->
      super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
      .
      super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ._M_payload._M_value._M_invoker = (_Invoker_type)0x0;
      local_28 = pcVar3;
    }
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_88 = (_Manager_type)0x0;
    if (p_Var2 != (_Manager_type)0x0) {
      local_98._M_unused._M_object = local_58._M_unused._M_object;
      local_98._8_8_ = local_58._8_8_;
      local_48 = (_Manager_type)0x0;
      p_Stack_40 = (_Invoker_type)0x0;
      local_88 = p_Var2;
    }
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_68 = (code *)0x0;
    p_Stack_20 = local_60;
    if (pcVar3 != (code *)0x0) {
      local_78._M_unused._M_object = local_38._M_unused._M_object;
      local_78._8_8_ = local_38._8_8_;
      local_28 = (code *)0x0;
      p_Stack_20 = (_Invoker_type)0x0;
      local_68 = pcVar3;
    }
    std::
    function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>
    ::
    function<trivialre::matchers::MatcherBuilder::Seq(std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>)::_lambda(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)_1_,void>
              ((function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>
                *)__return_storage_ptr__,(anon_class_64_2_208f5e76 *)&local_98);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_88 != (_Manager_type)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    if (local_48 != (_Manager_type)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  else {
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = left->_M_invoker;
    p_Var2 = (left->super__Function_base)._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      uVar4 = *(undefined8 *)((long)&(left->super__Function_base)._M_functor + 8);
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor =
           *(undefined8 *)&(left->super__Function_base)._M_functor;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = uVar4;
      (__return_storage_ptr__->super__Function_base)._M_manager = p_Var2;
      *pp_Var1 = (_Manager_type)0x0;
      left->_M_invoker = (_Invoker_type)0x0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matcher MaybeSeq(Matcher left, std::optional<Matcher> right) {
    if (right) {
      return builder.Seq(std::move(left), std::move(right.value()));
    }
    return left;
  }